

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O0

void copyPixels(string *type,MultiPartInputFile *inputFile,MultiPartOutputFile *outputFile,
               int inputPartNumber,int outputPartNumber)

{
  __type _Var1;
  int in_ECX;
  MultiPartOutputFile *in_RDX;
  MultiPartInputFile *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int in_R8D;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  
  _Var1 = std::operator==(unaff_retaddr,in_RDI);
  if (_Var1) {
    copyPixels<Imf_3_4::InputPart,Imf_3_4::OutputPart>(in_RSI,in_RDX,in_ECX,in_R8D);
  }
  else {
    _Var1 = std::operator==(unaff_retaddr,in_RDI);
    if (_Var1) {
      copyPixels<Imf_3_4::TiledInputPart,Imf_3_4::TiledOutputPart>(in_RSI,in_RDX,in_ECX,in_R8D);
    }
    else {
      _Var1 = std::operator==(unaff_retaddr,in_RDI);
      if (_Var1) {
        copyPixels<Imf_3_4::DeepScanLineInputPart,Imf_3_4::DeepScanLineOutputPart>
                  (in_RSI,in_RDX,in_ECX,in_R8D);
      }
      else {
        _Var1 = std::operator==(unaff_retaddr,in_RDI);
        if (_Var1) {
          copyPixels<Imf_3_4::DeepTiledInputPart,Imf_3_4::DeepTiledOutputPart>
                    (in_RSI,in_RDX,in_ECX,in_R8D);
        }
      }
    }
  }
  return;
}

Assistant:

void
copyPixels (
    const std::string&   type,
    MultiPartInputFile&  inputFile,
    MultiPartOutputFile& outputFile,
    int                  inputPartNumber,
    int                  outputPartNumber)
{
    //
    // Copy pixels from a given part of a multipart input file
    // to a given part of a multipart output file.
    //

    if (type == SCANLINEIMAGE)
    {
        copyPixels<InputPart, OutputPart> (
            inputFile, outputFile, inputPartNumber, outputPartNumber);
    }
    else if (type == TILEDIMAGE)
    {
        copyPixels<TiledInputPart, TiledOutputPart> (
            inputFile, outputFile, inputPartNumber, outputPartNumber);
    }
    else if (type == DEEPSCANLINE)
    {
        copyPixels<DeepScanLineInputPart, DeepScanLineOutputPart> (
            inputFile, outputFile, inputPartNumber, outputPartNumber);
    }
    else if (type == DEEPTILE)
    {
        copyPixels<DeepTiledInputPart, DeepTiledOutputPart> (
            inputFile, outputFile, inputPartNumber, outputPartNumber);
    }
}